

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

int __thiscall AddrInfo::GetTriedBucket(AddrInfo *this,uint256 *nKey,NetGroupManager *netgroupman)

{
  undefined8 uVar1;
  HashWriter *this_00;
  CSHA256 *this_01;
  long in_FS_OFFSET;
  uint256 result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  CSHA256 local_b8;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.buf[0x30] = '\0';
  local_b8.buf[0x31] = '\0';
  local_b8.buf[0x32] = '\0';
  local_b8.buf[0x33] = '\0';
  local_b8.buf[0x34] = '\0';
  local_b8.buf[0x35] = '\0';
  local_b8.buf[0x36] = '\0';
  local_b8.buf[0x37] = '\0';
  local_b8.buf[0x38] = '\0';
  local_b8.buf[0x39] = '\0';
  local_b8.buf[0x3a] = '\0';
  local_b8.buf[0x3b] = '\0';
  local_b8.buf[0x3c] = '\0';
  local_b8.buf[0x3d] = '\0';
  local_b8.buf[0x3e] = '\0';
  local_b8.buf[0x3f] = '\0';
  local_b8.buf[0x20] = '\0';
  local_b8.buf[0x21] = '\0';
  local_b8.buf[0x22] = '\0';
  local_b8.buf[0x23] = '\0';
  local_b8.buf[0x24] = '\0';
  local_b8.buf[0x25] = '\0';
  local_b8.buf[0x26] = '\0';
  local_b8.buf[0x27] = '\0';
  local_b8.buf[0x28] = '\0';
  local_b8.buf[0x29] = '\0';
  local_b8.buf[0x2a] = '\0';
  local_b8.buf[0x2b] = '\0';
  local_b8.buf[0x2c] = '\0';
  local_b8.buf[0x2d] = '\0';
  local_b8.buf[0x2e] = '\0';
  local_b8.buf[0x2f] = '\0';
  local_b8.buf[0x10] = '\0';
  local_b8.buf[0x11] = '\0';
  local_b8.buf[0x12] = '\0';
  local_b8.buf[0x13] = '\0';
  local_b8.buf[0x14] = '\0';
  local_b8.buf[0x15] = '\0';
  local_b8.buf[0x16] = '\0';
  local_b8.buf[0x17] = '\0';
  local_b8.buf[0x18] = '\0';
  local_b8.buf[0x19] = '\0';
  local_b8.buf[0x1a] = '\0';
  local_b8.buf[0x1b] = '\0';
  local_b8.buf[0x1c] = '\0';
  local_b8.buf[0x1d] = '\0';
  local_b8.buf[0x1e] = '\0';
  local_b8.buf[0x1f] = '\0';
  local_b8.buf[0] = '\0';
  local_b8.buf[1] = '\0';
  local_b8.buf[2] = '\0';
  local_b8.buf[3] = '\0';
  local_b8.buf[4] = '\0';
  local_b8.buf[5] = '\0';
  local_b8.buf[6] = '\0';
  local_b8.buf[7] = '\0';
  local_b8.buf[8] = '\0';
  local_b8.buf[9] = '\0';
  local_b8.buf[10] = '\0';
  local_b8.buf[0xb] = '\0';
  local_b8.buf[0xc] = '\0';
  local_b8.buf[0xd] = '\0';
  local_b8.buf[0xe] = '\0';
  local_b8.buf[0xf] = '\0';
  local_b8.s[4] = 0;
  local_b8.s[5] = 0;
  local_b8.s[6] = 0;
  local_b8.s[7] = 0;
  local_b8.s[0] = 0;
  local_b8.s[1] = 0;
  local_b8.s[2] = 0;
  local_b8.s[3] = 0;
  local_b8.bytes = 0;
  CSHA256::CSHA256(&local_b8);
  CSHA256::Write(&local_b8,(uchar *)nKey,0x20);
  CService::GetKey(&local_d0,(CService *)this);
  this_00 = HashWriter::operator<<((HashWriter *)&local_b8,&local_d0);
  HashWriter::GetHash(&local_50,this_00);
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.buf[0x30] = '\0';
  local_b8.buf[0x31] = '\0';
  local_b8.buf[0x32] = '\0';
  local_b8.buf[0x33] = '\0';
  local_b8.buf[0x34] = '\0';
  local_b8.buf[0x35] = '\0';
  local_b8.buf[0x36] = '\0';
  local_b8.buf[0x37] = '\0';
  local_b8.buf[0x38] = '\0';
  local_b8.buf[0x39] = '\0';
  local_b8.buf[0x3a] = '\0';
  local_b8.buf[0x3b] = '\0';
  local_b8.buf[0x3c] = '\0';
  local_b8.buf[0x3d] = '\0';
  local_b8.buf[0x3e] = '\0';
  local_b8.buf[0x3f] = '\0';
  local_b8.buf[0x20] = '\0';
  local_b8.buf[0x21] = '\0';
  local_b8.buf[0x22] = '\0';
  local_b8.buf[0x23] = '\0';
  local_b8.buf[0x24] = '\0';
  local_b8.buf[0x25] = '\0';
  local_b8.buf[0x26] = '\0';
  local_b8.buf[0x27] = '\0';
  local_b8.buf[0x28] = '\0';
  local_b8.buf[0x29] = '\0';
  local_b8.buf[0x2a] = '\0';
  local_b8.buf[0x2b] = '\0';
  local_b8.buf[0x2c] = '\0';
  local_b8.buf[0x2d] = '\0';
  local_b8.buf[0x2e] = '\0';
  local_b8.buf[0x2f] = '\0';
  local_b8.buf[0x10] = '\0';
  local_b8.buf[0x11] = '\0';
  local_b8.buf[0x12] = '\0';
  local_b8.buf[0x13] = '\0';
  local_b8.buf[0x14] = '\0';
  local_b8.buf[0x15] = '\0';
  local_b8.buf[0x16] = '\0';
  local_b8.buf[0x17] = '\0';
  local_b8.buf[0x18] = '\0';
  local_b8.buf[0x19] = '\0';
  local_b8.buf[0x1a] = '\0';
  local_b8.buf[0x1b] = '\0';
  local_b8.buf[0x1c] = '\0';
  local_b8.buf[0x1d] = '\0';
  local_b8.buf[0x1e] = '\0';
  local_b8.buf[0x1f] = '\0';
  local_b8.buf[0] = '\0';
  local_b8.buf[1] = '\0';
  local_b8.buf[2] = '\0';
  local_b8.buf[3] = '\0';
  local_b8.buf[4] = '\0';
  local_b8.buf[5] = '\0';
  local_b8.buf[6] = '\0';
  local_b8.buf[7] = '\0';
  local_b8.buf[8] = '\0';
  local_b8.buf[9] = '\0';
  local_b8.buf[10] = '\0';
  local_b8.buf[0xb] = '\0';
  local_b8.buf[0xc] = '\0';
  local_b8.buf[0xd] = '\0';
  local_b8.buf[0xe] = '\0';
  local_b8.buf[0xf] = '\0';
  local_b8.s[4] = 0;
  local_b8.s[5] = 0;
  local_b8.s[6] = 0;
  local_b8.s[7] = 0;
  local_b8.s[0] = 0;
  local_b8.s[1] = 0;
  local_b8.s[2] = 0;
  local_b8.s[3] = 0;
  local_b8.bytes = 0;
  CSHA256::CSHA256(&local_b8);
  CSHA256::Write(&local_b8,(uchar *)nKey,0x20);
  NetGroupManager::GetGroup(&local_d0,netgroupman,(CNetAddr *)this);
  this_01 = &HashWriter::operator<<((HashWriter *)&local_b8,&local_d0)->ctx;
  local_50.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ZEXT48(local_50.super_base_blob<256U>.m_data._M_elems._0_4_ & 7);
  CSHA256::Write(this_01,(uchar *)&local_50,8);
  HashWriter::GetHash(&local_50,(HashWriter *)this_01);
  uVar1 = local_50.super_base_blob<256U>.m_data._M_elems._0_8_;
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (uint)uVar1 & 0xff;
  }
  __stack_chk_fail();
}

Assistant:

int AddrInfo::GetTriedBucket(const uint256& nKey, const NetGroupManager& netgroupman) const
{
    uint64_t hash1 = (HashWriter{} << nKey << GetKey()).GetCheapHash();
    uint64_t hash2 = (HashWriter{} << nKey << netgroupman.GetGroup(*this) << (hash1 % ADDRMAN_TRIED_BUCKETS_PER_GROUP)).GetCheapHash();
    return hash2 % ADDRMAN_TRIED_BUCKET_COUNT;
}